

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelAggregates::~IfcRelAggregates(IfcRelAggregates *this,void **vtt)

{
  void **vtt_local;
  IfcRelAggregates *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelAggregates,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelAggregates,_0UL> *)
             &(this->super_IfcRelDecomposes).field_0xc8,vtt + 0x10);
  IfcRelDecomposes::~IfcRelDecomposes(&this->super_IfcRelDecomposes,vtt + 1);
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}